

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O3

ostream * std::operator<<(ostream *os,
                         vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *v)

{
  pointer phVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  phVar1 = (v->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>)._M_impl
      .super__Vector_impl_data._M_finish != phVar1) {
    uVar3 = 0;
    do {
      fVar4 = tinyusdz::value::half_to_float((half)phVar1[uVar3].value);
      std::ostream::_M_insert<double>((double)fVar4);
      phVar1 = (v->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar2 = (long)(v->
                    super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)phVar1 >> 1;
      if (uVar3 != uVar2 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        phVar1 = (v->
                 super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar2 = (long)(v->
                      super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)phVar1 >> 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}